

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrSTA0x99(CPU *this)

{
  CPU *in_RDI;
  uint8_t in_stack_0000000d;
  uint16_t in_stack_0000000e;
  
  absolute_y_addr_j(in_RDI);
  Memory::Write8((Memory *)this,in_stack_0000000e,in_stack_0000000d);
  return 5;
}

Assistant:

int CPU::instrSTA0x99() {
	m->Write8(absolute_y_addr_j(), A);
	return 5;
}